

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

int opengv::absolute_pose::modules::gp3p::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  Index in_stack_fffffffffffff6d8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *in_stack_fffffffffffff6e0;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *this;
  
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,0x8c1c8d);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *)(*pdVar5 * -1.0);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1cb5);
  *pSVar6 = (Scalar)this;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1cd3);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1cf3);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1d13);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1d3b);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1d59);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1d79);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1d99);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1dc1);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1ddf);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1dff);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1e1d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1e3d);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1e61);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1e87);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1ead);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1ecb);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1eeb);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1f0f);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1f35);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1f5b);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1f7b);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1f9c);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar7,auVar43);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c1fda);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c1ffd);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c201f);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar8,auVar44);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2060);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2081);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c20a4);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c20ce);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c20fa);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2126);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2149);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2174);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2195);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c21b8);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c21db);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c21fd);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar9,auVar45);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2255);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2278);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c229c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar10,auVar46);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c22dd);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c22fe);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2338);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2362);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c238e);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c23ba);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c23dc);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2408);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c242b);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c244f);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2471);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c249d);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c24c0);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c24e4);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2506);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2532);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2555);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2579);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c259c);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c25be);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c25ea);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2615);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2642);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2665);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2689);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar11,auVar47);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c26cb);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c26ee);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2710);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c273c);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2767);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2794);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c27b7);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c27d8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar12,auVar48);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2831);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2854);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2876);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c28a2);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c28cd);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c28fa);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c291c);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2948);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c296b);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c298f);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c29b0);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c29d3);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar13,auVar49);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2a15);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2a38);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2a5c);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar14,auVar50);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2ab5);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2ad8);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2b11);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2b3d);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2b68);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2b95);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2bb9);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2be5);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2c08);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2c2c);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2c50);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2c7c);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2c9f);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2cc3);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2ce7);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2d13);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2d36);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2d5a);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2d7d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2da1);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2dcd);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2dfa);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2e27);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2e4a);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2e6c);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar15,auVar51);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2eae);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2ed1);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2ef5);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2f21);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2f4e);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c2f7b);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2f9c);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c2fbf);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar16,auVar52);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3001);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3024);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3048);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3074);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c30a1);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c30ce);
  *pSVar6 = ((dVar1 - dVar2) + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c30f2);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c311e);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3141);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3165);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3186);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c31a9);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar17,auVar53);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3202);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3225);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3247);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar18,auVar54);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3289);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c32ac);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c32e7);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3313);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3340);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c336d);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3390);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c33bc);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c33df);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3403);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3426);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3452);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3475);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3499);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c34bc);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c34e8);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c350b);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c352f);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3552);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3575);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c35a1);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c35cd);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c35fa);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c361d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3640);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c366c);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3698);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c36c5);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c36e9);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c370b);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar19,auVar55);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c374d);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c376f);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3793);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar20,auVar56);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c37d5);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c37f8);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c381b);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3847);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3873);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c38a0);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c38c3);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c38ef);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3912);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3936);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3958);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c397c);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar21,auVar57);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c39d5);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c39f9);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3a1b);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar22,auVar58);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3a5d);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3a80);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3aba);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3ae6);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3b12);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3b3f);
  *pSVar6 = ((-dVar1 + dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3b63);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3b8f);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3bb1);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3bd5);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3bf9);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3c25);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3c47);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3c6b);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3c8f);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3cbb);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3cdd);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3d01);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3d23);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3d45);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3d72);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3d9f);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3dcc);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3dee);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3e12);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar23,auVar59);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3e6b);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3e8d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3eaf);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3edc);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3f09);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3f36);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3f59);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3f7c);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar24,auVar60);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c3fbe);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c3fe0);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4002);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c402f);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c405c);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4089);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c40ad);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c40d9);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c40fb);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c411f);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4142);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4165);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar25,auVar61);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c41a7);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c41cb);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c41ed);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar26,auVar62);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4246);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4268);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c42a3);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c42d0);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c42fb);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4328);
  *pSVar6 = ((-dVar1 + dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c434a);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4376);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c439a);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c43be);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c43e0);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c440c);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4430);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4454);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4476);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c44a2);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c44c6);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c44ea);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c450e);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4532);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c455d);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4588);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c45b5);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c45d7);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c45fb);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar27,auVar63);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c463d);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4661);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4685);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c46b0);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c46db);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4708);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c472b);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c474e);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar28,auVar64);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4790);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c47b4);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c47d8);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4803);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c482e);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c485b);
  *pSVar6 = ((dVar1 + dVar2) - dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c487d);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c48a9);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c48cd);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c48f1);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4914);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4937);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar29,auVar65);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4990);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c49b2);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c49d6);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar30,auVar66);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4a18);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4a3c);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4a75);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4aa0);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4acd);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4afa);
  *pSVar6 = ((-dVar1 + dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4b1d);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4b41);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4b62);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4b8e);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4bb1);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4bd5);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4bf6);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4c22);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4c45);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4c69);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4c8a);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4cb6);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4cd7);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4d0f);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4d3b);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4d67);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4d94);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4db5);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4ded);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4e19);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4e45);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4e72);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4e95);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4eb7);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar31,auVar67);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4f10);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4f33);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4f57);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar32,auVar68);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c4fb0);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c4fd1);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5009);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5035);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5061);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c508e);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c50b1);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c50d5);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c50f6);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5122);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5145);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5169);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar33,auVar69);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c51ab);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c51ce);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c51f0);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar34,auVar70);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5249);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c526a);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c528d);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c52b7);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c52e3);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5310);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5334);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5358);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c537b);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c53a7);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c53cb);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c53ef);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5412);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c543e);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5462);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5486);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c54a9);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c54d5);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c54f8);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5532);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c555f);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c558c);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c55b9);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c55db);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c55fe);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar35,auVar71);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5640);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5663);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c569d);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c56ca);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c56f7);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5724);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5745);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5768);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar36,auVar72);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c57c1);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c57e4);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c581e);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c584b);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5878);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c58a5);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c58c9);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c58ed);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5910);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c593c);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c595d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5980);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar37,auVar73);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c59d9);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c59fc);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5a1e);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar38,auVar74);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5a60);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5a83);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5aa7);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5ad3);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5b00);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5b2d);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5b4f);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5b73);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5b96);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5bc2);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5be4);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5c08);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5c2b);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5c57);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5c79);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5c9d);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5cc0);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5cec);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5d0f);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5d49);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5d74);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5d9f);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5dcc);
  *pSVar6 = (-dVar1 + dVar2 + dVar3) - dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5def);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5e13);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar39,auVar75);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5e6c);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5e8f);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5ec9);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5ef4);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5f1f);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5f4c);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5f6d);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c5f90);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar40,auVar76);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c5fe9);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c600c);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c6046);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c6071);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c609c);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c60c9);
  *pSVar6 = (-dVar1 - dVar2) + dVar3 + dVar4;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c60eb);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c610f);
  *pSVar6 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c6132);
  dVar1 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c615e);
  *pSVar6 = dVar1 * -1.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,9199999);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c61a2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *pdVar5 * 2.0;
  auVar7 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar41,auVar77);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c61e4);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c6207);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c622b);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = -(*pdVar5 * 2.0);
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar42,auVar78);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c6284);
  *pSVar6 = auVar7._0_8_;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c62a7);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c62c9);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c62f5);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_fffffffffffff6d8,0x8c6320);
  dVar4 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,in_stack_fffffffffffff6d8,0x8c634d);
  *pSVar6 = ((dVar1 - dVar2) - dVar3) + dVar4;
  return (int)pSVar6;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::init(
    Eigen::Matrix<double,48,85> & groebnerMatrix,
    const Eigen::Matrix<double,3,3> & f,
    const Eigen::Matrix<double,3,3> & v,
    const Eigen::Matrix<double,3,3> & p )
{
  groebnerMatrix(0,20) = -1*f(0,1);
  groebnerMatrix(0,21) = f(0,0);
  groebnerMatrix(0,32) = -1*f(0,1);
  groebnerMatrix(0,33) = f(0,0);
  groebnerMatrix(0,52) = -1*f(0,1);
  groebnerMatrix(0,53) = f(0,0);
  groebnerMatrix(0,66) = (((v(0,0)-v(0,1))+p(0,0))-p(0,1));
  groebnerMatrix(0,71) = (((v(0,0)-v(0,1))+p(0,0))-p(0,1));
  groebnerMatrix(0,75) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(0,76) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(0,77) = (((v(0,0)-v(0,1))-p(0,0))+p(0,1));
  groebnerMatrix(0,79) = -1*f(0,1);
  groebnerMatrix(0,80) = f(0,0);
  groebnerMatrix(0,81) = (2*p(1,0)-2*p(1,1));
  groebnerMatrix(0,82) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(0,84) = (((-p(0,0)+p(0,1))+v(0,0))-v(0,1));
  groebnerMatrix(1,20) = -1*f(1,1);
  groebnerMatrix(1,21) = f(1,0);
  groebnerMatrix(1,32) = -1*f(1,1);
  groebnerMatrix(1,33) = f(1,0);
  groebnerMatrix(1,52) = -1*f(1,1);
  groebnerMatrix(1,53) = f(1,0);
  groebnerMatrix(1,66) = (((v(1,0)-v(1,1))+p(1,0))-p(1,1));
  groebnerMatrix(1,70) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(1,71) = (((v(1,0)-v(1,1))-p(1,0))+p(1,1));
  groebnerMatrix(1,76) = (2*p(0,1)-2*p(0,0));
  groebnerMatrix(1,77) = (((v(1,0)-v(1,1))+p(1,0))-p(1,1));
  groebnerMatrix(1,79) = -1*f(1,1);
  groebnerMatrix(1,80) = f(1,0);
  groebnerMatrix(1,81) = (-2*p(0,0)+2*p(0,1));
  groebnerMatrix(1,83) = (2*p(2,0)-2*p(2,1));
  groebnerMatrix(1,84) = (((-p(1,0)+p(1,1))+v(1,0))-v(1,1));
  groebnerMatrix(2,20) = -1*f(2,1);
  groebnerMatrix(2,21) = f(2,0);
  groebnerMatrix(2,32) = -1*f(2,1);
  groebnerMatrix(2,33) = f(2,0);
  groebnerMatrix(2,52) = -1*f(2,1);
  groebnerMatrix(2,53) = f(2,0);
  groebnerMatrix(2,66) = (((v(2,0)-v(2,1))-p(2,0))+p(2,1));
  groebnerMatrix(2,70) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(2,71) = (((v(2,0)-v(2,1))+p(2,0))-p(2,1));
  groebnerMatrix(2,75) = (-2*p(0,0)+2*p(0,1));
  groebnerMatrix(2,77) = (((v(2,0)-v(2,1))+p(2,0))-p(2,1));
  groebnerMatrix(2,79) = -1*f(2,1);
  groebnerMatrix(2,80) = f(2,0);
  groebnerMatrix(2,82) = (2*p(0,0)-2*p(0,1));
  groebnerMatrix(2,83) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(2,84) = (((-p(2,0)+p(2,1))+v(2,0))-v(2,1));
  groebnerMatrix(3,19) = -1*f(0,2);
  groebnerMatrix(3,20) = f(0,1);
  groebnerMatrix(3,31) = -1*f(0,2);
  groebnerMatrix(3,32) = f(0,1);
  groebnerMatrix(3,51) = -1*f(0,2);
  groebnerMatrix(3,52) = f(0,1);
  groebnerMatrix(3,66) = (((v(0,1)+p(0,1))-v(0,2))-p(0,2));
  groebnerMatrix(3,71) = (((v(0,1)+p(0,1))-v(0,2))-p(0,2));
  groebnerMatrix(3,75) = (-2*p(2,1)+2*p(2,2));
  groebnerMatrix(3,76) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(3,77) = (((v(0,1)-p(0,1))-v(0,2))+p(0,2));
  groebnerMatrix(3,78) = -1*f(0,2);
  groebnerMatrix(3,79) = f(0,1);
  groebnerMatrix(3,81) = (2*p(1,1)-2*p(1,2));
  groebnerMatrix(3,82) = (-2*p(2,1)+2*p(2,2));
  groebnerMatrix(3,84) = (((-p(0,1)+p(0,2))-v(0,2))+v(0,1));
  groebnerMatrix(4,19) = -1*f(1,2);
  groebnerMatrix(4,20) = f(1,1);
  groebnerMatrix(4,31) = -1*f(1,2);
  groebnerMatrix(4,32) = f(1,1);
  groebnerMatrix(4,51) = -1*f(1,2);
  groebnerMatrix(4,52) = f(1,1);
  groebnerMatrix(4,66) = (((v(1,1)+p(1,1))-v(1,2))-p(1,2));
  groebnerMatrix(4,70) = (2*p(2,2)-2*p(2,1));
  groebnerMatrix(4,71) = (((v(1,1)-p(1,1))-v(1,2))+p(1,2));
  groebnerMatrix(4,76) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(4,77) = (((v(1,1)+p(1,1))-v(1,2))-p(1,2));
  groebnerMatrix(4,78) = -1*f(1,2);
  groebnerMatrix(4,79) = f(1,1);
  groebnerMatrix(4,81) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(4,83) = (2*p(2,1)-2*p(2,2));
  groebnerMatrix(4,84) = (((-p(1,1)+p(1,2))-v(1,2))+v(1,1));
  groebnerMatrix(5,19) = -1*f(2,2);
  groebnerMatrix(5,20) = f(2,1);
  groebnerMatrix(5,31) = -1*f(2,2);
  groebnerMatrix(5,32) = f(2,1);
  groebnerMatrix(5,51) = -1*f(2,2);
  groebnerMatrix(5,52) = f(2,1);
  groebnerMatrix(5,66) = (((v(2,1)-p(2,1))-v(2,2))+p(2,2));
  groebnerMatrix(5,70) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(5,71) = (((v(2,1)+p(2,1))-v(2,2))-p(2,2));
  groebnerMatrix(5,75) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(5,77) = (((v(2,1)+p(2,1))-v(2,2))-p(2,2));
  groebnerMatrix(5,78) = -1*f(2,2);
  groebnerMatrix(5,79) = f(2,1);
  groebnerMatrix(5,82) = (2*p(0,1)-2*p(0,2));
  groebnerMatrix(5,83) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(5,84) = (((-p(2,1)+p(2,2))-v(2,2))+v(2,1));
  groebnerMatrix(6,19) = f(0,2);
  groebnerMatrix(6,21) = -1*f(0,0);
  groebnerMatrix(6,31) = f(0,2);
  groebnerMatrix(6,33) = -1*f(0,0);
  groebnerMatrix(6,51) = f(0,2);
  groebnerMatrix(6,53) = -1*f(0,0);
  groebnerMatrix(6,66) = (((-v(0,0)-p(0,0))+v(0,2))+p(0,2));
  groebnerMatrix(6,71) = (((-v(0,0)-p(0,0))+v(0,2))+p(0,2));
  groebnerMatrix(6,75) = (2*p(2,0)-2*p(2,2));
  groebnerMatrix(6,76) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(6,77) = (((-v(0,0)+p(0,0))+v(0,2))-p(0,2));
  groebnerMatrix(6,78) = f(0,2);
  groebnerMatrix(6,80) = -1*f(0,0);
  groebnerMatrix(6,81) = (-2*p(1,0)+2*p(1,2));
  groebnerMatrix(6,82) = (2*p(2,0)-2*p(2,2));
  groebnerMatrix(6,84) = (((p(0,0)-p(0,2))-v(0,0))+v(0,2));
  groebnerMatrix(7,19) = f(1,2);
  groebnerMatrix(7,21) = -1*f(1,0);
  groebnerMatrix(7,31) = f(1,2);
  groebnerMatrix(7,33) = -1*f(1,0);
  groebnerMatrix(7,51) = f(1,2);
  groebnerMatrix(7,53) = -1*f(1,0);
  groebnerMatrix(7,66) = (((-v(1,0)-p(1,0))+v(1,2))+p(1,2));
  groebnerMatrix(7,70) = (-2*p(2,2)+2*p(2,0));
  groebnerMatrix(7,71) = (((-v(1,0)+p(1,0))+v(1,2))-p(1,2));
  groebnerMatrix(7,76) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(7,77) = (((-v(1,0)-p(1,0))+v(1,2))+p(1,2));
  groebnerMatrix(7,78) = f(1,2);
  groebnerMatrix(7,80) = -1*f(1,0);
  groebnerMatrix(7,81) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(7,83) = (-2*p(2,0)+2*p(2,2));
  groebnerMatrix(7,84) = (((p(1,0)-p(1,2))-v(1,0))+v(1,2));
  groebnerMatrix(8,19) = f(2,2);
  groebnerMatrix(8,21) = -1*f(2,0);
  groebnerMatrix(8,31) = f(2,2);
  groebnerMatrix(8,33) = -1*f(2,0);
  groebnerMatrix(8,51) = f(2,2);
  groebnerMatrix(8,53) = -1*f(2,0);
  groebnerMatrix(8,66) = (((-v(2,0)+p(2,0))+v(2,2))-p(2,2));
  groebnerMatrix(8,70) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(8,71) = (((-v(2,0)-p(2,0))+v(2,2))+p(2,2));
  groebnerMatrix(8,75) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(8,77) = (((-v(2,0)-p(2,0))+v(2,2))+p(2,2));
  groebnerMatrix(8,78) = f(2,2);
  groebnerMatrix(8,80) = -1*f(2,0);
  groebnerMatrix(8,82) = (-2*p(0,0)+2*p(0,2));
  groebnerMatrix(8,83) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(8,84) = (((p(2,0)-p(2,2))-v(2,0))+v(2,2));
}